

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O0

void __thiscall icu_63::double_conversion::Bignum::AddBignum(Bignum *this,Bignum *other)

{
  int iVar1;
  int b;
  uint uVar2;
  uint *puVar3;
  Chunk sum_1;
  Chunk sum;
  int i;
  int bigit_pos;
  Chunk carry;
  Bignum *other_local;
  Bignum *this_local;
  
  Align(this,other);
  iVar1 = BigitLength(this);
  b = BigitLength(other);
  iVar1 = Max<int>(iVar1,b);
  EnsureCapacity(this,(iVar1 + 1) - this->exponent_);
  i = 0;
  sum = other->exponent_ - this->exponent_;
  for (sum_1 = 0; (int)sum_1 < other->used_digits_; sum_1 = sum_1 + 1) {
    puVar3 = Vector<unsigned_int>::operator[](&this->bigits_,sum);
    uVar2 = *puVar3;
    puVar3 = Vector<unsigned_int>::operator[](&other->bigits_,sum_1);
    uVar2 = uVar2 + *puVar3 + i;
    puVar3 = Vector<unsigned_int>::operator[](&this->bigits_,sum);
    *puVar3 = uVar2 & 0xfffffff;
    i = uVar2 >> 0x1c;
    sum = sum + 1;
  }
  for (; i != 0; i = uVar2 + i >> 0x1c) {
    puVar3 = Vector<unsigned_int>::operator[](&this->bigits_,sum);
    uVar2 = *puVar3;
    puVar3 = Vector<unsigned_int>::operator[](&this->bigits_,sum);
    *puVar3 = uVar2 + i & 0xfffffff;
    sum = sum + 1;
  }
  iVar1 = Max<int>(sum,this->used_digits_);
  this->used_digits_ = iVar1;
  return;
}

Assistant:

void Bignum::AddBignum(const Bignum& other) {
  ASSERT(IsClamped());
  ASSERT(other.IsClamped());

  // If this has a greater exponent than other append zero-bigits to this.
  // After this call exponent_ <= other.exponent_.
  Align(other);

  // There are two possibilities:
  //   aaaaaaaaaaa 0000  (where the 0s represent a's exponent)
  //     bbbbb 00000000
  //   ----------------
  //   ccccccccccc 0000
  // or
  //    aaaaaaaaaa 0000
  //  bbbbbbbbb 0000000
  //  -----------------
  //  cccccccccccc 0000
  // In both cases we might need a carry bigit.

  EnsureCapacity(1 + Max(BigitLength(), other.BigitLength()) - exponent_);
  Chunk carry = 0;
  int bigit_pos = other.exponent_ - exponent_;
  ASSERT(bigit_pos >= 0);
  for (int i = 0; i < other.used_digits_; ++i) {
    Chunk sum = bigits_[bigit_pos] + other.bigits_[i] + carry;
    bigits_[bigit_pos] = sum & kBigitMask;
    carry = sum >> kBigitSize;
    bigit_pos++;
  }

  while (carry != 0) {
    Chunk sum = bigits_[bigit_pos] + carry;
    bigits_[bigit_pos] = sum & kBigitMask;
    carry = sum >> kBigitSize;
    bigit_pos++;
  }
  used_digits_ = Max(bigit_pos, used_digits_);
  ASSERT(IsClamped());
}